

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_TEXM3X3VSPEC(Context *ctx)

{
  char *pcVar1;
  RegisterList *pRVar2;
  uint local_424;
  char *ttypestr;
  TextureType ttype;
  RegisterList *sreg;
  char code [512];
  char sampler [64];
  char src4 [64];
  char src3 [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  DestArgInfo *info;
  Context *ctx_local;
  
  if (ctx->texm3x3pad_src1 != -1) {
    ctx->metal_need_header_texture = 1;
    ctx->metal_need_header_geometric = 1;
    emit_METAL_TEXM3X3SPEC_helper(ctx);
    get_METAL_varname_in_buf(ctx,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum,code + 0x1f8,0x40);
    get_METAL_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_dst0,src1 + 0x38,0x40);
    get_METAL_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_src0,src2 + 0x38,0x40);
    get_METAL_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_dst1,src3 + 0x38,0x40);
    get_METAL_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x3pad_src1,src4 + 0x38,0x40);
    get_METAL_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->source_args[0].regnum,sampler + 0x38,0x40);
    get_METAL_destarg_varname(ctx,src0 + 0x38,0x40);
    pRVar2 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum);
    if (pRVar2 == (RegisterList *)0x0) {
      local_424 = 0;
    }
    else {
      local_424 = pRVar2->index;
    }
    pcVar1 = "texture3D";
    if (local_424 == 3) {
      pcVar1 = "textureCube";
    }
    make_METAL_destarg_assign
              (ctx,(char *)&sreg,0x200,
               "texture%s(%s, TEXM3X3SPEC_reflection(float3(dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz)), float3(%s.w, %s.w, %s.w)))"
               ,pcVar1 + 7,code + 0x1f8,src1 + 0x38,src2 + 0x38,src3 + 0x38,src4 + 0x38,src0 + 0x38,
               sampler + 0x38,src1 + 0x38,src3 + 0x38,src0 + 0x38);
    output_line(ctx,"%s",&sreg);
  }
  return;
}

Assistant:

static void emit_METAL_TEXM3X3VSPEC(Context *ctx)
{
    if (ctx->texm3x3pad_src1 == -1)
        return;

    DestArgInfo *info = &ctx->dest_arg;
    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];
    char src3[64];
    char src4[64];
    char sampler[64];
    char code[512];

    ctx->metal_need_header_texture = 1;
    ctx->metal_need_header_geometric = 1;

    emit_METAL_TEXM3X3SPEC_helper(ctx);

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                            sampler, sizeof (sampler));

    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst0,
                            src0, sizeof (src0));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src0,
                            src1, sizeof (src1));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst1,
                            src2, sizeof (src2));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src1,
                            src3, sizeof (src3));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src4, sizeof (src4));
    get_METAL_destarg_varname(ctx, dst, sizeof (dst));

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                      info->regnum);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);
    const char *ttypestr = (ttype == TEXTURE_TYPE_CUBE) ? "Cube" : "3D";

    make_METAL_destarg_assign(ctx, code, sizeof (code),
        "texture%s(%s, "
            "TEXM3X3SPEC_reflection("
                "float3("
                    "dot(%s.xyz, %s.xyz), "
                    "dot(%s.xyz, %s.xyz), "
                    "dot(%s.xyz, %s.xyz)"
                "), "
                "float3(%s.w, %s.w, %s.w)"
            ")"
        ")",
        ttypestr, sampler, src0, src1, src2, src3, dst, src4, src0, src2, dst);

    output_line(ctx, "%s", code);
}